

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

Vec_Int_t * Gia_RsbWindowInit(Gia_Man_t *p,Vec_Int_t *vPaths,int iPivot,int nIter)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vVisited;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  int iNode;
  int iMeet;
  
  vVisited = Vec_IntAlloc(100);
  pGVar4 = Gia_ManObj(p,iPivot);
  if (((int)(uint)*(undefined8 *)pGVar4 < 0) ||
     (((uint)*(undefined8 *)pGVar4 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x31a,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
  }
  iVar3 = 2;
  while (iVar3 != 0) {
    uVar2 = (uint)((ulong)*(undefined8 *)pGVar4 >> 0x20);
    if (iVar3 == 2) {
      uVar2 = (uint)*(undefined8 *)pGVar4;
    }
    iVar5 = iPivot - (uVar2 & 0x1fffffff);
    Gia_ManIncrementTravId(p);
    Vec_IntPush(vVisited,iVar5);
    Vec_IntWriteEntry(vPaths,iVar5,0);
    Gia_ObjSetTravIdCurrentId(p,iVar5);
    iVar3 = iVar3 + -1;
  }
  iVar3 = 0;
  if (0 < nIter) {
    iVar3 = nIter;
  }
  iVar6 = 0;
  iVar5 = 0;
  do {
    if (iVar3 == iVar6) {
LAB_00622855:
      if (iVar3 == nIter) {
        if (vVisited != (Vec_Int_t *)0x0) {
          free(vVisited->pArray);
          free(vVisited);
        }
        vVisited = (Vec_Int_t *)0x0;
      }
      return vVisited;
    }
    iVar1 = vVisited->nSize;
    iVar5 = Gia_RsbWindowExplore(p,vVisited,iVar5,vPaths,&iMeet,&iNode);
    if (iVar5 != 0) {
      iVar3 = Gia_ObjIsTravIdCurrentId(p,iMeet);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsTravIdPreviousId(p,iMeet);
        if (iVar3 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x32f,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
        }
        iVar5 = Gia_ObjIsTravIdCurrentId(p,iNode);
        iVar3 = iNode;
        if (iVar5 == 0) {
          __assert_fail("Gia_ObjIsTravIdCurrentId(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x32e,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
        }
      }
      else {
        iVar5 = Gia_ObjIsTravIdPreviousId(p,iNode);
        iVar3 = iNode;
        if (iVar5 == 0) {
          __assert_fail("Gia_ObjIsTravIdPreviousId(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                        ,0x32c,"Vec_Int_t *Gia_RsbWindowInit(Gia_Man_t *, Vec_Int_t *, int, int)");
        }
      }
      vVisited->nSize = 0;
      iVar5 = Vec_IntEntry(vPaths,iMeet);
      Gia_RsbWindowGather(p,vPaths,iVar5,vVisited);
      Gia_RsbWindowGather(p,vPaths,iVar3,vVisited);
      Vec_IntPush(vVisited,iPivot);
      iVar3 = iVar6;
      goto LAB_00622855;
    }
    iVar6 = iVar6 + 1;
    iVar5 = iVar1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_RsbWindowInit( Gia_Man_t * p, Vec_Int_t * vPaths, int iPivot, int nIter )
{
    Vec_Int_t * vVisited = Vec_IntAlloc( 100 );
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot ); 
    int i, n, iStart = 0;
    assert( Gia_ObjIsAnd(pPivot) );
    // start paths for both fanins of the pivot node
    for ( n = 0; n < 2; n++ )
    {
        int iFan = Gia_ObjFaninId( pPivot, iPivot, n );
        Gia_ManIncrementTravId(p);
        Vec_IntPush( vVisited, iFan );
        Vec_IntWriteEntry( vPaths, iFan, 0 ); 
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    // perform several iterations of breadth-first search
    for ( i = 0; i < nIter; i++ )
    {
        int iMeet, iNode, iNext = Vec_IntSize(vVisited);
        if ( Gia_RsbWindowExplore( p, vVisited, iStart, vPaths, &iMeet, &iNode ) )
        {
            // found the shared path
            if ( Gia_ObjIsTravIdCurrentId(p, iMeet) )
                assert( Gia_ObjIsTravIdPreviousId(p, iNode) );
            else if ( Gia_ObjIsTravIdPreviousId(p, iMeet) )
                assert( Gia_ObjIsTravIdCurrentId(p, iNode) );
            else assert( 0 );
            // collect the initial window
            Vec_IntClear( vVisited );
            Gia_RsbWindowGather( p, vPaths, Vec_IntEntry(vPaths, iMeet), vVisited );
            Gia_RsbWindowGather( p, vPaths, iNode, vVisited );
            Vec_IntPush( vVisited, iPivot );
            break;
        }
        iStart = iNext;
    }
    // if no meeting point is found, make sure to return NULL
    if ( i == nIter )
        Vec_IntFreeP( &vVisited );
    return vVisited;
}